

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O2

QSize __thiscall QToolBarLayout::expandedSize(QToolBarLayout *this,QSize *size)

{
  long lVar1;
  QLayoutStruct *pQVar2;
  bool bVar3;
  Orientation OVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  QWidget *pQVar10;
  QWidget *this_00;
  QStyle *pQVar11;
  QSize QVar12;
  int extraout_var;
  QSize QVar13;
  Representation RVar14;
  int iVar15;
  long lVar16;
  QSize *pQVar17;
  bool *pbVar18;
  Representation RVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  Representation RVar27;
  ulong uVar28;
  ulong uVar29;
  long in_FS_OFFSET;
  double dVar30;
  QMargins QVar31;
  int local_e4;
  Representation local_c8;
  Representation local_c0;
  QStyleOptionToolBar opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->dirty == true) {
    updateGeomArray(this);
  }
  pQVar10 = QLayout::parentWidget(&this->super_QLayout);
  pQVar10 = &QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&pQVar10->super_QObject)->
             super_QWidget;
  QVar13.wd.m_i = 0;
  QVar13.ht.m_i = 0;
  if (pQVar10 != (QWidget *)0x0) {
    this_00 = &QtPrivate::qobject_cast_helper<QMainWindow*,QObject>
                         (*(QObject **)(*(long *)&pQVar10->field_0x8 + 0x10))->super_QWidget;
    OVar4 = QToolBar::orientation((QToolBar *)pQVar10);
    pQVar11 = QWidget::style(pQVar10);
    opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionToolBar::QStyleOptionToolBar(&opt);
    (**(code **)(*(long *)pQVar10 + 0x1a0))(pQVar10,&opt);
    bVar3 = movable(this);
    if (bVar3) {
      uVar5 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x35,&opt,pQVar10);
      QVar13.ht.m_i = 0;
      QVar13.wd.m_i = uVar5;
    }
    QVar31 = QLayout::contentsMargins(&this->super_QLayout);
    iVar6 = (**(code **)(*(long *)&this->super_QLayout + 0x60))(this);
    iVar7 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x39,&opt,pQVar10);
    lVar16 = (this->items).d.size;
    pbVar18 = &((this->geomArray).d.ptr)->empty;
    iVar23 = 0;
    iVar8 = 0;
    while (bVar3 = lVar16 != 0, lVar16 = lVar16 + -1, bVar3) {
      if (*pbVar18 == false) {
        iVar20 = iVar6;
        if (iVar8 == 0) {
          iVar20 = 0;
        }
        iVar23 = iVar20 + iVar23 + *(int *)(pbVar18 + -9);
        iVar8 = iVar8 + 1;
      }
      pbVar18 = pbVar18 + 0x20;
    }
    if (iVar8 == 0) {
      uVar28 = 0;
      RVar27.m_i = 0;
    }
    else {
      pQVar17 = (QSize *)&size->ht;
      if (OVar4 == Horizontal) {
        pQVar17 = size;
      }
      dVar30 = (double)iVar8;
      uVar5 = (pQVar17->wd).m_i;
      if (dVar30 < 0.0) {
        dVar30 = sqrt(dVar30);
      }
      else {
        dVar30 = SQRT(dVar30);
      }
      iVar8 = 2;
      if ((int)dVar30 != 1) {
        iVar8 = (int)dVar30;
      }
      iVar7 = iVar7 + iVar6;
      iVar8 = iVar23 / iVar8 + iVar7;
      local_c0 = QVar31.m_left.m_i;
      RVar19.m_i = QVar31.m_top.m_i.m_i;
      if (OVar4 == Horizontal) {
        RVar19.m_i = local_c0.m_i;
      }
      local_c8 = QVar31.m_right.m_i;
      RVar14.m_i = QVar31.m_bottom.m_i.m_i;
      if (OVar4 == Horizontal) {
        RVar14.m_i = local_c8.m_i;
      }
      iVar20 = RVar19.m_i + QVar13.wd.m_i.m_i + RVar14.m_i;
      iVar23 = uVar5 - iVar20;
      if (iVar23 < iVar8) {
        iVar23 = iVar8;
      }
      local_e4 = iVar23;
      if (this_00 != (QWidget *)0x0) {
        QVar12 = QWidget::size(this_00);
        RVar27 = QVar12.ht.m_i;
        if (OVar4 == Horizontal) {
          RVar27 = QVar12.wd.m_i;
        }
        local_e4 = RVar27.m_i - iVar20;
        if (iVar23 < local_e4) {
          local_e4 = iVar23;
        }
      }
      iVar8 = 0;
      iVar23 = 0;
      uVar28 = 0;
      while( true ) {
        uVar29 = (ulong)(int)uVar28;
        lVar16 = (this->items).d.size;
        if (lVar16 <= (long)uVar29) break;
        lVar21 = uVar29 << 5;
        iVar20 = 0;
        iVar25 = 0;
        iVar22 = 0;
        uVar28 = 0xffffffffffffffff;
        for (; (long)uVar29 < lVar16; uVar29 = uVar29 + 1) {
          pQVar2 = (this->geomArray).d.ptr;
          if ((&pQVar2->empty)[lVar21] == false) {
            iVar15 = iVar6;
            if (iVar22 == 0) {
              iVar15 = 0;
            }
            iVar24 = iVar15 + iVar20 + *(int *)((long)&pQVar2->minimumSize + lVar21);
            iVar9 = (*((this->items).d.ptr[uVar29]->super_QWidgetItem).super_QLayoutItem.
                      _vptr_QLayoutItem[2])();
            iVar15 = extraout_var;
            if (OVar4 == Vertical) {
              iVar15 = iVar9;
            }
            if (iVar15 < iVar25) {
              iVar15 = iVar25;
            }
            iVar25 = iVar15;
            if (((int)uVar28 != -1) && (local_e4 < iVar24)) {
              if (iVar22 < 2) {
                uVar28 = uVar29 & 0xffffffff;
              }
              else if (local_e4 < iVar7 + iVar20) {
                iVar20 = iVar20 - ((this->geomArray).d.ptr[(int)uVar28].minimumSize + iVar6);
              }
              else {
                uVar28 = uVar29 & 0xffffffff;
              }
              goto LAB_0047308f;
            }
            iVar22 = iVar22 + 1;
            lVar16 = (this->items).d.size;
            uVar28 = uVar29 & 0xffffffff;
            iVar20 = iVar24;
          }
          lVar21 = lVar21 + 0x20;
        }
        uVar28 = uVar29 & 0xffffffff;
LAB_0047308f:
        if (iVar8 < iVar20) {
          iVar8 = iVar20;
        }
        iVar23 = iVar23 + iVar6 + iVar25;
      }
      uVar26 = iVar7 + QVar13.wd.m_i.m_i + local_c0.m_i + local_c8.m_i + iVar8;
      if ((int)uVar26 <= (int)uVar5) {
        uVar26 = uVar5;
      }
      RVar27.m_i = uVar26;
      if (this_00 != (QWidget *)0x0) {
        QVar13 = QWidget::size(this_00);
        RVar27 = QVar13.ht.m_i;
        if (OVar4 == Horizontal) {
          RVar27 = QVar13.wd.m_i;
        }
        if ((int)uVar26 < RVar27.m_i) {
          RVar27.m_i = uVar26;
        }
      }
      uVar5 = ((QVar31.m_bottom.m_i.m_i + QVar31.m_top.m_i.m_i) - iVar6) + iVar23;
      uVar28 = (ulong)uVar5;
      if (OVar4 != Horizontal) {
        if (OVar4 != Vertical) {
          RVar27.m_i = uVar5;
        }
        uVar28 = (ulong)(uint)RVar27.m_i;
        RVar27.m_i = 0xffffffff;
        if (OVar4 == Vertical) {
          RVar27.m_i = uVar5;
        }
      }
    }
    QStyleOption::~QStyleOption(&opt.super_QStyleOption);
    QVar13 = (QSize)((ulong)(uint)RVar27.m_i | uVar28 << 0x20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return QVar13;
}

Assistant:

QSize QToolBarLayout::expandedSize(const QSize &size) const
{
    if (dirty)
        updateGeomArray();

    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return QSize(0, 0);
    QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget());
    Qt::Orientation o = tb->orientation();
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int handleExtent = movable()
            ? style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb) : 0;
    const QMargins margins = contentsMargins();
    const int spacing = this->spacing();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);

    int total_w = 0;
    int count = 0;
    for (int x = 0; x < items.size(); ++x) {
        if (!geomArray[x].empty) {
            total_w += (count == 0 ? 0 : spacing) + geomArray[x].minimumSize;
            ++count;
        }
    }
    if (count == 0)
        return QSize(0, 0);

    int min_w = pick(o, size);
    int rows = (int)qSqrt(qreal(count));
    if (rows == 1)
        ++rows;      // we want to expand to at least two rows
    int space = total_w/rows + spacing + extensionExtent;
    space = qMax(space, min_w - pick(o, margins) - handleExtent);
    if (win != nullptr)
        space = qMin(space, pick(o, win->size()) - pick(o, margins) - handleExtent);

    int w = 0;
    int h = 0;
    int i = 0;
    while (i < items.size()) {
        int count = 0;
        int size = 0;
        int prev = -1;
        int rowHeight = 0;
        for (; i < items.size(); ++i) {
            if (geomArray[i].empty)
                continue;

            int newSize = size + (count == 0 ? 0 : spacing) + geomArray[i].minimumSize;
            rowHeight = qMax(rowHeight, perp(o, items.at(i)->sizeHint()));
            if (prev != -1 && newSize > space) {
                if (count > 1 && size + spacing + extensionExtent > space) {
                    size -= spacing + geomArray[prev].minimumSize;
                    i = prev;
                }
                break;
            }

            size = newSize;
            prev = i;
            ++count;
        }

        w = qMax(size, w);
        h += rowHeight + spacing;
    }

    w += pick(Qt::Horizontal, margins) + handleExtent + spacing + extensionExtent;
    w = qMax(w, min_w);
    if (win != nullptr)
        w = qMin(w, pick(o, win->size()));
    h += pick(Qt::Vertical, margins) - spacing; //there is no spacing before the first row

    QSize result;
    rpick(o, result) = w;
    rperp(o, result) = h;
    return result;
}